

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O3

void Hacl_Bignum25519_reduce(uint64_t *out)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t t3;
  ulong uVar3;
  uint64_t b0;
  uint64_t b0_1;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t b4;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t t4;
  
  uVar1 = (*out >> 0x33) + out[1];
  uVar2 = (uVar1 >> 0x33) + out[2];
  uVar3 = (uVar2 >> 0x33) + out[3];
  uVar4 = (uVar3 >> 0x33) + out[4];
  uVar5 = (uVar4 >> 0x33) * 0x13 + (*out & 0x7ffffffffffff);
  uVar8 = (uVar5 >> 0x33) + (uVar1 & 0x7ffffffffffff);
  uVar9 = (uVar8 >> 0x33) + (uVar2 & 0x7ffffffffffff);
  uVar2 = (uVar9 >> 0x33) + (uVar3 & 0x7ffffffffffff);
  uVar7 = (uVar2 >> 0x33) + (uVar4 & 0x7ffffffffffff);
  uVar1 = (uVar7 >> 0x33) * 0x13 + (uVar5 & 0x7ffffffffffff);
  uVar6 = uVar1 & 0x7ffffffffffff;
  uVar8 = (uVar1 >> 0x33) + (uVar8 & 0x7ffffffffffff);
  uVar10 = uVar8 << 0x20 & (uVar8 ^ 0xfff8000000000000);
  uVar10 = uVar10 << 0x10 & uVar10;
  uVar10 = uVar10 << 8 & uVar10;
  uVar10 = uVar10 << 4 & uVar10;
  uVar10 = uVar10 * 4 & uVar10;
  uVar5 = uVar9 << 0x20 & (uVar9 | 0xfff8000000000000);
  uVar5 = uVar5 << 0x10 & uVar5;
  uVar5 = uVar5 << 8 & uVar5;
  uVar5 = uVar5 << 4 & uVar5;
  uVar5 = uVar5 * 4 & uVar5;
  uVar3 = uVar2 << 0x20 & (uVar2 | 0xfff8000000000000);
  uVar3 = uVar3 << 0x10 & uVar3;
  uVar3 = uVar3 << 8 & uVar3;
  uVar3 = uVar3 << 4 & uVar3;
  uVar3 = uVar3 * 4 & uVar3;
  uVar4 = uVar7 << 0x20 & (uVar7 | 0xfff8000000000000);
  uVar4 = uVar4 << 0x10 & uVar4;
  uVar4 = uVar4 << 8 & uVar4;
  uVar4 = uVar4 << 4 & uVar4;
  uVar4 = uVar4 * 4 & uVar4;
  uVar1 = 0;
  if (0x7ffffffffffec < uVar6) {
    uVar1 = (long)(uVar10 * 2 & uVar10) >> 0x3f;
  }
  uVar1 = (long)(uVar4 & uVar3 * 2 & uVar3 & uVar4 * 2 & uVar5 * 2 & uVar5) >> 0x3f & uVar1;
  uVar3 = uVar1 & 0x7ffffffffffff;
  *out = uVar6 - (uVar1 & 0x7ffffffffffed);
  out[1] = uVar8 - uVar3;
  out[2] = (uVar9 & 0x7ffffffffffff) - uVar3;
  out[3] = (uVar2 & 0x7ffffffffffff) - uVar3;
  out[4] = (uVar7 & 0x7ffffffffffff) - uVar3;
  return;
}

Assistant:

static void Hacl_EC_Format_fcontract_first_carry_pass(uint64_t *input)
{
  uint64_t t0 = input[0U];
  uint64_t t1 = input[1U];
  uint64_t t2 = input[2U];
  uint64_t t3 = input[3U];
  uint64_t t4 = input[4U];
  uint64_t t1_ = t1 + (t0 >> (uint32_t)51U);
  uint64_t t0_ = t0 & (uint64_t)0x7ffffffffffffU;
  uint64_t t2_ = t2 + (t1_ >> (uint32_t)51U);
  uint64_t t1__ = t1_ & (uint64_t)0x7ffffffffffffU;
  uint64_t t3_ = t3 + (t2_ >> (uint32_t)51U);
  uint64_t t2__ = t2_ & (uint64_t)0x7ffffffffffffU;
  uint64_t t4_ = t4 + (t3_ >> (uint32_t)51U);
  uint64_t t3__ = t3_ & (uint64_t)0x7ffffffffffffU;
  input[0U] = t0_;
  input[1U] = t1__;
  input[2U] = t2__;
  input[3U] = t3__;
  input[4U] = t4_;
}